

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O3

void __thiscall
lf::fe::DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>::
DiffusionElementMatrixProvider
          (DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
           *this,shared_ptr<const_lf::fe::ScalarFESpace<double>_> *fe_space,
          MeshFunctionConstant<double> alpha)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->alpha_).value_ = alpha.value_;
  (this->fe_space_).
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (fe_space->
           super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (fe_space->
           super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (fe_space->super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->fe_space_).
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->fe_space_).
  super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (fe_space->super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  quad::QuadRuleCache::QuadRuleCache(&this->qr_cache_);
  return;
}

Assistant:

DiffusionElementMatrixProvider<SCALAR, DIFF_COEFF>::
    DiffusionElementMatrixProvider(
        std::shared_ptr<const ScalarFESpace<SCALAR>> fe_space, DIFF_COEFF alpha)
    : alpha_(std::move(alpha)), fe_space_(std::move(fe_space)) {}